

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

optional<cmGlobalGenerator::FrameworkDescriptor> * __thiscall
cmGlobalGenerator::SplitFrameworkPath
          (optional<cmGlobalGenerator::FrameworkDescriptor> *__return_storage_ptr__,
          cmGlobalGenerator *this,string *path,FrameworkFormat format)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string name;
  string libname;
  string ext;
  string local_1d0;
  string local_1b0;
  uint *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  uint *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  string local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  pointer local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  pointer local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  uint *local_f0;
  undefined8 local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  uint *local_d0;
  undefined8 local_c8;
  uint local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  pointer local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  uint *local_90;
  undefined8 local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  uint *local_70;
  undefined8 local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  string local_50;
  
  if (SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)::
      frameworkPath == '\0') {
    iVar2 = __cxa_guard_acquire(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                                 ::frameworkPath);
    if (iVar2 != 0) {
      SplitFrameworkPath::frameworkPath.regmust = (char *)0x0;
      SplitFrameworkPath::frameworkPath.program = (char *)0x0;
      SplitFrameworkPath::frameworkPath.progsize = 0;
      memset(&SplitFrameworkPath::frameworkPath,0,0xaa);
      cmsys::RegularExpression::compile
                (&SplitFrameworkPath::frameworkPath,
                 "((.+)/)?(.+)\\.framework(/Versions/[^/]+)?(/(.+))?$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&SplitFrameworkPath::frameworkPath,
                   &__dso_handle);
      __cxa_guard_release(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                           ::frameworkPath);
    }
  }
  cmsys::SystemTools::GetFilenameLastExtension(&local_50,path);
  if (local_50._M_string_length == 0) {
LAB_0025c539:
    bVar1 = cmsys::RegularExpression::find
                      (&SplitFrameworkPath::frameworkPath,(path->_M_dataplus)._M_p,
                       &SplitFrameworkPath::frameworkPath.regmatch);
    if (!bVar1) goto LAB_0025c577;
    if (SplitFrameworkPath::frameworkPath.regmatch.startp[3] == (char *)0x0) {
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      local_1d0._M_string_length = 0;
      local_1d0.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,SplitFrameworkPath::frameworkPath.regmatch.startp[3],
                 SplitFrameworkPath::frameworkPath.regmatch.endp[3]);
    }
    if (SplitFrameworkPath::frameworkPath.regmatch.startp[6] == (char *)0x0) {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      local_1b0._M_string_length = 0;
      local_1b0.field_2._M_allocated_capacity =
           local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
    else {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,SplitFrameworkPath::frameworkPath.regmatch.startp[6],
                 SplitFrameworkPath::frameworkPath.regmatch.endp[6]);
    }
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_150,&local_1b0);
    paVar4 = &local_1b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar4) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0 && format == Strict) {
LAB_0025c69d:
      (__return_storage_ptr__->
      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
      super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = false;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_1b0._M_dataplus._M_p = (pointer)local_150._M_string_length;
        local_1b0._M_string_length = (size_type)local_150._M_dataplus._M_p;
        __str._M_str = local_1d0._M_dataplus._M_p;
        __str._M_len = local_1d0._M_string_length;
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_1b0,0,
                           local_1d0._M_string_length,__str);
        if (iVar2 != 0) goto LAB_0025c69d;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_150._M_string_length ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) || (local_1d0._M_string_length == local_150._M_string_length))
        goto LAB_0025c88f;
        local_130 = &local_120;
        if (SplitFrameworkPath::frameworkPath.regmatch.startp[2] == (char *)0x0) {
          local_128 = (pointer)0x0;
          local_120._M_allocated_capacity._0_4_ = local_120._M_allocated_capacity._0_4_ & 0xffffff00
          ;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,SplitFrameworkPath::frameworkPath.regmatch.startp[2],
                     SplitFrameworkPath::frameworkPath.regmatch.endp[2]);
        }
        local_f0 = &local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_1d0._M_dataplus._M_p,
                   (undefined1 *)(local_1d0._M_string_length + (long)local_1d0._M_dataplus._M_p));
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_150);
        if (local_130 == &local_120) {
          local_1b0.field_2._8_4_ = local_120._8_4_;
          local_1b0.field_2._12_4_ = local_120._12_4_;
          local_1b0._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_1b0._M_dataplus._M_p = (pointer)local_130;
        }
        local_1b0.field_2._M_allocated_capacity._4_4_ = local_120._M_allocated_capacity._4_4_;
        local_1b0.field_2._M_allocated_capacity._0_4_ = local_120._M_allocated_capacity._0_4_;
        local_1b0._M_string_length = (size_type)local_128;
        local_128 = (pointer)0x0;
        local_120._M_allocated_capacity._0_4_ = local_120._M_allocated_capacity._0_4_ & 0xffffff00;
        if (local_f0 == &local_e0) {
          uStack_178 = uStack_d8;
          uStack_174 = uStack_d4;
          local_190 = (uint *)&local_180;
        }
        else {
          local_190 = local_f0;
        }
        local_180 = CONCAT44(uStack_dc,local_e0);
        local_188 = local_e8;
        local_e8 = 0;
        local_e0 = local_e0 & 0xffffff00;
        if (local_70 == &local_60) {
          uStack_158 = uStack_58;
          uStack_154 = uStack_54;
          local_170 = (uint *)&local_160;
        }
        else {
          local_170 = local_70;
        }
        local_160 = CONCAT44(uStack_5c,local_60);
        local_168 = local_68;
        local_68 = 0;
        local_60 = local_60 & 0xffffff00;
        local_130 = &local_120;
        local_f0 = &local_e0;
        local_70 = &local_60;
        std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::
        _Storage<cmGlobalGenerator::FrameworkDescriptor,_false>::
        _Storage<cmGlobalGenerator::FrameworkDescriptor>
                  ((_Storage<cmGlobalGenerator::FrameworkDescriptor,_false> *)__return_storage_ptr__
                  );
        (__return_storage_ptr__->
        super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
        super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
        super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = true;
        if (local_170 != (uint *)&local_160) {
          operator_delete(local_170,local_160 + 1);
        }
        if (local_190 != (uint *)&local_180) {
          operator_delete(local_190,local_180 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar4) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT44(uStack_5c,local_60) + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,CONCAT44(uStack_dc,local_e0) + 1);
        }
        if (local_130 != &local_120) {
          lVar3 = CONCAT44(local_120._M_allocated_capacity._4_4_,
                           local_120._M_allocated_capacity._0_4_);
          paVar4 = local_130;
          goto LAB_0025ca46;
        }
        goto LAB_0025ca4e;
      }
LAB_0025c88f:
      local_110 = &local_100;
      if (SplitFrameworkPath::frameworkPath.regmatch.startp[2] == (char *)0x0) {
        local_108 = (pointer)0x0;
        local_100._M_allocated_capacity._0_4_ = local_100._M_allocated_capacity._0_4_ & 0xffffff00;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,SplitFrameworkPath::frameworkPath.regmatch.startp[2],
                   SplitFrameworkPath::frameworkPath.regmatch.endp[2]);
      }
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_1d0._M_dataplus._M_p,
                 (undefined1 *)(local_1d0._M_string_length + (long)local_1d0._M_dataplus._M_p));
      if (local_110 == &local_100) {
        local_1b0.field_2._8_4_ = local_100._8_4_;
        local_1b0.field_2._12_4_ = local_100._12_4_;
        local_1b0._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_1b0._M_dataplus._M_p = (pointer)local_110;
      }
      local_1b0.field_2._M_allocated_capacity._4_4_ = local_100._M_allocated_capacity._4_4_;
      local_1b0.field_2._M_allocated_capacity._0_4_ = local_100._M_allocated_capacity._0_4_;
      local_1b0._M_string_length = (size_type)local_108;
      local_108 = (pointer)0x0;
      local_100._M_allocated_capacity._0_4_ = local_100._M_allocated_capacity._0_4_ & 0xffffff00;
      if (local_90 == &local_80) {
        uStack_178 = uStack_78;
        uStack_174 = uStack_74;
        local_190 = (uint *)&local_180;
      }
      else {
        local_190 = local_90;
      }
      local_180 = CONCAT44(uStack_7c,local_80);
      local_188 = local_88;
      local_88 = 0;
      local_80 = local_80 & 0xffffff00;
      local_168 = 0;
      local_160 = local_160 & 0xffffffffffffff00;
      local_170 = (uint *)&local_160;
      local_110 = &local_100;
      local_90 = &local_80;
      std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::
      _Storage<cmGlobalGenerator::FrameworkDescriptor,_false>::
      _Storage<cmGlobalGenerator::FrameworkDescriptor>
                ((_Storage<cmGlobalGenerator::FrameworkDescriptor,_false> *)__return_storage_ptr__,
                 &local_1b0);
      (__return_storage_ptr__->
      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
      super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = true;
      if (local_170 != (uint *)&local_160) {
        operator_delete(local_170,local_160 + 1);
      }
      if (local_190 != (uint *)&local_180) {
        operator_delete(local_190,local_180 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != paVar4) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT44(uStack_7c,local_80) + 1);
      }
      if (local_110 == &local_100) goto LAB_0025ca4e;
      lVar3 = CONCAT44(local_100._M_allocated_capacity._4_4_,local_100._M_allocated_capacity._0_4_);
      paVar4 = local_110;
LAB_0025ca46:
      operator_delete(paVar4,lVar3 + 1);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) goto LAB_0025c539;
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) goto LAB_0025c539;
LAB_0025c577:
    if (format != Extended) {
      (__return_storage_ptr__->
      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
      super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = false;
      goto LAB_0025ca8a;
    }
    cmsys::SystemTools::GetParentDirectory(&local_1d0,path);
    cmsys::SystemTools::GetFilenameLastExtension(&local_1b0,path);
    iVar2 = std::__cxx11::string::compare((char *)&local_1b0);
    if (iVar2 == 0) {
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_150,path);
    }
    else {
      cmsys::SystemTools::GetFilenameName(&local_150,path);
    }
    paVar4 = &local_1b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar4) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_1d0._M_dataplus._M_p,
               (undefined1 *)(local_1d0._M_string_length + (long)local_1d0._M_dataplus._M_p));
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_150._M_dataplus._M_p,
               (char *)(local_150._M_string_length + (long)local_150._M_dataplus._M_p));
    if (local_b0 == &local_a0) {
      local_1b0.field_2._8_4_ = local_a0._8_4_;
      local_1b0.field_2._12_4_ = local_a0._12_4_;
      local_1b0._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_1b0._M_dataplus._M_p = (pointer)local_b0;
    }
    local_1b0.field_2._M_allocated_capacity._4_4_ = local_a0._M_allocated_capacity._4_4_;
    local_1b0.field_2._M_allocated_capacity._0_4_ = local_a0._M_allocated_capacity._0_4_;
    local_1b0._M_string_length = (size_type)local_a8;
    local_a8 = (pointer)0x0;
    local_a0._M_allocated_capacity._0_4_ = local_a0._M_allocated_capacity._0_4_ & 0xffffff00;
    if (local_d0 == &local_c0) {
      uStack_178 = uStack_b8;
      uStack_174 = uStack_b4;
      local_190 = (uint *)&local_180;
    }
    else {
      local_190 = local_d0;
    }
    local_180 = CONCAT44(uStack_bc,local_c0);
    local_188 = local_c8;
    local_c8 = 0;
    local_c0 = local_c0 & 0xffffff00;
    local_168 = 0;
    local_160 = local_160 & 0xffffffffffffff00;
    local_170 = (uint *)&local_160;
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::
    _Storage<cmGlobalGenerator::FrameworkDescriptor,_false>::
    _Storage<cmGlobalGenerator::FrameworkDescriptor>
              ((_Storage<cmGlobalGenerator::FrameworkDescriptor,_false> *)__return_storage_ptr__,
               &local_1b0);
    (__return_storage_ptr__->
    super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
    super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
    super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = true;
    if (local_170 != (uint *)&local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != (uint *)&local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar4) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,CONCAT44(uStack_bc,local_c0) + 1);
    }
    if (local_b0 != &local_a0) {
      lVar3 = CONCAT44(local_a0._M_allocated_capacity._4_4_,local_a0._M_allocated_capacity._0_4_);
      paVar4 = local_b0;
      goto LAB_0025ca46;
    }
  }
LAB_0025ca4e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
LAB_0025ca8a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmGlobalGenerator::FrameworkDescriptor>
cmGlobalGenerator::SplitFrameworkPath(const std::string& path,
                                      FrameworkFormat format) const
{
  // Check for framework structure:
  //    (/path/to/)?FwName.framework
  // or (/path/to/)?FwName.framework/FwName(.tbd)?
  // or (/path/to/)?FwName.framework/Versions/*/FwName(.tbd)?
  static cmsys::RegularExpression frameworkPath(
    "((.+)/)?(.+)\\.framework(/Versions/[^/]+)?(/(.+))?$");

  auto ext = cmSystemTools::GetFilenameLastExtension(path);
  if ((ext.empty() || ext == ".tbd" || ext == ".framework") &&
      frameworkPath.find(path)) {
    auto name = frameworkPath.match(3);
    auto libname =
      cmSystemTools::GetFilenameWithoutExtension(frameworkPath.match(6));
    if (format == FrameworkFormat::Strict && libname.empty()) {
      return cm::nullopt;
    }
    if (!libname.empty() && !cmHasPrefix(libname, name)) {
      return cm::nullopt;
    }

    if (libname.empty() || name.size() == libname.size()) {
      return FrameworkDescriptor{ frameworkPath.match(2), name };
    }

    return FrameworkDescriptor{ frameworkPath.match(2), name,
                                libname.substr(name.size()) };
  }

  if (format == FrameworkFormat::Extended) {
    // path format can be more flexible: (/path/to/)?fwName(.framework)?
    auto fwDir = cmSystemTools::GetParentDirectory(path);
    auto name = cmSystemTools::GetFilenameLastExtension(path) == ".framework"
      ? cmSystemTools::GetFilenameWithoutExtension(path)
      : cmSystemTools::GetFilenameName(path);

    return FrameworkDescriptor{ fwDir, name };
  }

  return cm::nullopt;
}